

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::UnmapTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice)

{
  USAGE Usage;
  TextureVkImpl *DstTextureVk;
  iterator __it;
  undefined4 in_register_0000000c;
  char (*Args_1) [56];
  char (*in_stack_ffffffffffffff98) [71];
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  string _msg;
  Char *local_38;
  
  Args_1 = (char (*) [56])CONCAT44(in_register_0000000c,ArraySlice);
  ArraySlice_local = ArraySlice;
  MipLevel_local = MipLevel;
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapTextureSubresource
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,MipLevel,ArraySlice);
  DstTextureVk = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pTexture);
  Usage = (DstTextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage;
  if (Usage != USAGE_STAGING) {
    if (Usage == USAGE_DYNAMIC) {
      _msg._M_dataplus._M_p = (pointer)DstTextureVk;
      _msg._M_string_length._0_4_ = MipLevel;
      _msg._M_string_length._4_4_ = ArraySlice;
      __it = std::
             _Hashtable<Diligent::DeviceContextVkImpl::MappedTextureKey,_std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->m_MappedTextures)._M_h,(key_type *)&_msg);
      if (__it.
          super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
          ._M_cur != (__node_type *)0x0) {
        CopyBufferToTexture(this,*(VkBuffer *)
                                  (*(long *)((long)__it.
                                                  super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                                                  ._M_cur + 0x58) + 0xf8),
                            *(Uint64 *)
                             ((long)__it.
                                    super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                                    ._M_cur + 0x60),
                            *(Uint32 *)
                             ((long)__it.
                                    super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                                    ._M_cur + 0x28),DstTextureVk,
                            (Box *)((long)__it.
                                          super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                                          ._M_cur + 0x40),MipLevel,ArraySlice,
                            RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
        std::
        _Hashtable<Diligent::DeviceContextVkImpl::MappedTextureKey,_std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->m_MappedTextures)._M_h,
                (const_iterator)
                __it.
                super__Node_iterator_base<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false>
                ._M_cur);
        return;
      }
      FormatString<char[27],unsigned_int,char[9],unsigned_int,char[14],char_const*,char[71]>
                (&_msg,(Diligent *)"Failed to unmap mip level ",(char (*) [27])&MipLevel_local,
                 (uint *)", slice ",(char (*) [9])&ArraySlice_local,(uint *)0x6e35fc,
                 (char (*) [14])
                 &(DstTextureVk->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_Desc,(char **)
                          "\'. The texture has either been unmapped already or has not been mapped",
                 in_stack_ffffffffffffff98);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      local_38 = GetUsageString(Usage);
      FormatString<char_const*,char[56]>
                (&_msg,(Diligent *)&local_38,
                 (char **)" textures cannot currently be mapped in Vulkan back-end",Args_1);
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"UnmapTextureSubresource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb05);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UnmapTextureSubresource(ITexture* pTexture,
                                                  Uint32    MipLevel,
                                                  Uint32    ArraySlice)
{
    TDeviceContextBase::UnmapTextureSubresource(pTexture, MipLevel, ArraySlice);

    TextureVkImpl&     TextureVk = *ClassPtrCast<TextureVkImpl>(pTexture);
    const TextureDesc& TexDesc   = TextureVk.GetDesc();

    if (TexDesc.Usage == USAGE_DYNAMIC)
    {
        auto UploadSpaceIt = m_MappedTextures.find(MappedTextureKey{&TextureVk, MipLevel, ArraySlice});
        if (UploadSpaceIt != m_MappedTextures.end())
        {
            MappedTexture& MappedTex = UploadSpaceIt->second;
            CopyBufferToTexture(MappedTex.Allocation.pDynamicMemMgr->GetVkBuffer(),
                                MappedTex.Allocation.AlignedOffset,
                                MappedTex.CopyInfo.RowStrideInTexels,
                                TextureVk,
                                MappedTex.CopyInfo.Region,
                                MipLevel,
                                ArraySlice,
                                RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
            m_MappedTextures.erase(UploadSpaceIt);
        }
        else
        {
            LOG_ERROR_MESSAGE("Failed to unmap mip level ", MipLevel, ", slice ", ArraySlice, " of texture '", TexDesc.Name, "'. The texture has either been unmapped already or has not been mapped");
        }
    }
    else if (TexDesc.Usage == USAGE_STAGING)
    {
        if (TexDesc.CPUAccessFlags & CPU_ACCESS_READ)
        {
            // Nothing needs to be done
        }
        else if (TexDesc.CPUAccessFlags & CPU_ACCESS_WRITE)
        {
            // Upload textures are currently created with VK_MEMORY_PROPERTY_HOST_COHERENT_BIT, so
            // there is no need to explicitly flush the mapped range.
        }
    }
    else
    {
        UNSUPPORTED(GetUsageString(TexDesc.Usage), " textures cannot currently be mapped in Vulkan back-end");
    }
}